

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::ResultInfo::getExpandedExpression_abi_cxx11_(string *__return_storage_ptr__,ResultInfo *this)

{
  bool bVar1;
  allocator<char> local_19;
  ResultInfo *local_18;
  ResultInfo *this_local;
  
  local_18 = this;
  this_local = (ResultInfo *)__return_storage_ptr__;
  bVar1 = hasExpression(this);
  if (bVar1) {
    getExpandedExpressionInternal_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ResultInfo::getExpandedExpression() const {
        return hasExpression() ? getExpandedExpressionInternal() : "";
    }